

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

string * __thiscall
google::protobuf::io::SimpleDtoa_abi_cxx11_(string *__return_storage_ptr__,io *this,double value)

{
  char *__s;
  allocator<char> local_39;
  char local_38 [8];
  char buffer [32];
  double value_local;
  
  buffer._24_8_ = value;
  __s = anon_unknown_0::DoubleToBuffer(value,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_39)
  ;
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleDtoa(double value) {
  char buffer[kDoubleToBufferSize];
  return DoubleToBuffer(value, buffer);
}